

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiIO::AddKeyAnalogEvent(ImGuiIO *this,ImGuiKey key,bool down,float analog_value)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiKeyData *pIVar3;
  ImGuiInputEvent *pIVar4;
  byte local_64;
  undefined1 local_58 [8];
  ImGuiInputEvent e;
  int n_1;
  bool found;
  ImGuiKeyData *key_data;
  int n;
  ImGuiContext *g;
  float analog_value_local;
  bool down_local;
  ImGuiKey key_local;
  ImGuiIO *this_local;
  
  pIVar1 = GImGui;
  if (key != 0) {
    if (&GImGui->IO != this) {
      __assert_fail("&g.IO == this && \"Can only add events to current context.\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                    ,0x518,"void ImGuiIO::AddKeyAnalogEvent(ImGuiKey, bool, float)");
    }
    bVar2 = ImGui::IsNamedKey(key);
    if (!bVar2) {
      __assert_fail("ImGui::IsNamedKey(key)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                    ,0x519,"void ImGuiIO::AddKeyAnalogEvent(ImGuiKey, bool, float)");
    }
    if ((this->BackendUsingLegacyKeyArrays == -1) ||
       (bVar2 = false, this->BackendUsingLegacyKeyArrays == '\0')) {
      bVar2 = true;
    }
    if (!bVar2) {
      __assert_fail("(BackendUsingLegacyKeyArrays == -1 || BackendUsingLegacyKeyArrays == 0) && \"Backend needs to either only use io.AddKeyEvent(), either only fill legacy io.KeysDown[] + io.KeyMap[]. Not both!\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                    ,0x51d,"void ImGuiIO::AddKeyAnalogEvent(ImGuiKey, bool, float)");
    }
    if (this->BackendUsingLegacyKeyArrays == -1) {
      for (key_data._4_4_ = 0x200; key_data._4_4_ < 0x285; key_data._4_4_ = key_data._4_4_ + 1) {
        if (this->KeyMap[key_data._4_4_] != -1) {
          __assert_fail("KeyMap[n] == -1 && \"Backend needs to either only use io.AddKeyEvent(), either only fill legacy io.KeysDown[] + io.KeyMap[]. Not both!\""
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                        ,0x520,"void ImGuiIO::AddKeyAnalogEvent(ImGuiKey, bool, float)");
        }
      }
    }
    this->BackendUsingLegacyKeyArrays = '\0';
    bVar2 = ImGui::IsGamepadKey(key);
    if (bVar2) {
      this->BackendUsingLegacyNavInputArray = false;
    }
    pIVar3 = ImGui::GetKeyData(key);
    if ((bool)(pIVar3->Down & 1U) == down) {
      if ((pIVar3->AnalogValue == analog_value) && (!NAN(pIVar3->AnalogValue) && !NAN(analog_value))
         ) {
        e._23_1_ = 0;
        e.field_2.Key.AnalogValue = (float)(pIVar1->InputEventsQueue).Size;
        while( true ) {
          e.field_2.Key.AnalogValue = (float)((int)e.field_2.Key.AnalogValue + -1);
          local_64 = 0;
          if (-1 < (int)e.field_2.Key.AnalogValue) {
            local_64 = e._23_1_ ^ 0xff;
          }
          if ((local_64 & 1) == 0) break;
          pIVar4 = ImVector<ImGuiInputEvent>::operator[]
                             (&pIVar1->InputEventsQueue,(int)e.field_2.Key.AnalogValue);
          if ((pIVar4->Type == ImGuiInputEventType_Key) &&
             (pIVar4 = ImVector<ImGuiInputEvent>::operator[]
                                 (&pIVar1->InputEventsQueue,(int)e.field_2.Key.AnalogValue),
             (pIVar4->field_2).MouseButton.Button == key)) {
            e._23_1_ = 1;
          }
        }
        if ((e._23_1_ & 1) == 0) {
          return;
        }
      }
    }
    ImGuiInputEvent::ImGuiInputEvent((ImGuiInputEvent *)local_58);
    local_58._0_4_ = ImGuiInputEventType_Key;
    bVar2 = ImGui::IsGamepadKey(key);
    local_58._4_4_ = ImGuiInputSource_Keyboard;
    if (bVar2) {
      local_58._4_4_ = ImGuiInputSource_Gamepad;
    }
    e.Type = key;
    e.Source._0_1_ = down;
    e.field_2.MousePos.PosX = analog_value;
    ImVector<ImGuiInputEvent>::push_back(&pIVar1->InputEventsQueue,(ImGuiInputEvent *)local_58);
  }
  return;
}

Assistant:

void ImGuiIO::AddKeyAnalogEvent(ImGuiKey key, bool down, float analog_value)
{
    //if (e->Down) { IMGUI_DEBUG_LOG("AddKeyEvent() Key='%s' %d, NativeKeycode = %d, NativeScancode = %d\n", ImGui::GetKeyName(e->Key), e->Down, e->NativeKeycode, e->NativeScancode); }
    if (key == ImGuiKey_None)
        return;
    ImGuiContext& g = *GImGui;
    IM_ASSERT(&g.IO == this && "Can only add events to current context.");
    IM_ASSERT(ImGui::IsNamedKey(key)); // Backend needs to pass a valid ImGuiKey_ constant. 0..511 values are legacy native key codes which are not accepted by this API.

    // Verify that backend isn't mixing up using new io.AddKeyEvent() api and old io.KeysDown[] + io.KeyMap[] data.
#ifndef IMGUI_DISABLE_OBSOLETE_KEYIO
    IM_ASSERT((BackendUsingLegacyKeyArrays == -1 || BackendUsingLegacyKeyArrays == 0) && "Backend needs to either only use io.AddKeyEvent(), either only fill legacy io.KeysDown[] + io.KeyMap[]. Not both!");
    if (BackendUsingLegacyKeyArrays == -1)
        for (int n = ImGuiKey_NamedKey_BEGIN; n < ImGuiKey_NamedKey_END; n++)
            IM_ASSERT(KeyMap[n] == -1 && "Backend needs to either only use io.AddKeyEvent(), either only fill legacy io.KeysDown[] + io.KeyMap[]. Not both!");
    BackendUsingLegacyKeyArrays = 0;
#endif
    if (ImGui::IsGamepadKey(key))
        BackendUsingLegacyNavInputArray = false;

    // Partial filter of duplicates (not strictly needed, but makes data neater in particular for key mods and gamepad values which are most commonly spmamed)
    ImGuiKeyData* key_data = ImGui::GetKeyData(key);
    if (key_data->Down == down && key_data->AnalogValue == analog_value)
    {
        bool found = false;
        for (int n = g.InputEventsQueue.Size - 1; n >= 0 && !found; n--)
            if (g.InputEventsQueue[n].Type == ImGuiInputEventType_Key && g.InputEventsQueue[n].Key.Key == key)
                found = true;
        if (!found)
            return;
    }

    // Add event
    ImGuiInputEvent e;
    e.Type = ImGuiInputEventType_Key;
    e.Source = ImGui::IsGamepadKey(key) ? ImGuiInputSource_Gamepad : ImGuiInputSource_Keyboard;
    e.Key.Key = key;
    e.Key.Down = down;
    e.Key.AnalogValue = analog_value;
    g.InputEventsQueue.push_back(e);
}